

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O3

void __thiscall
QGraphicsProxyWidget::paint
          (QGraphicsProxyWidget *this,QPainter *painter,QStyleOptionGraphicsItem *option,
          QWidget *widget)

{
  long lVar1;
  QRect QVar2;
  QRect QVar3;
  QRect QVar4;
  int iVar5;
  GraphicsItemFlags GVar6;
  qreal qVar7;
  long *plVar8;
  QWidget *this_00;
  long in_FS_OFFSET;
  QRegion local_88;
  undefined8 uStack_80;
  QSizeF local_78;
  QRectF local_60;
  QRect local_40;
  long local_30;
  
  QVar4._8_8_ = local_40._8_8_;
  QVar4._0_8_ = local_40._0_8_;
  QVar3._8_8_ = local_40._8_8_;
  QVar3._0_8_ = local_40._0_8_;
  QVar2._8_8_ = local_40._8_8_;
  QVar2._0_8_ = local_40._0_8_;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 0x18);
  if ((((*(long *)(lVar1 + 0x208) != 0) &&
       (local_40 = QVar2, *(int *)(*(long *)(lVar1 + 0x208) + 4) != 0)) &&
      (local_40 = QVar3, *(long *)(lVar1 + 0x210) != 0)) &&
     (local_40 = QVar4, (*(byte *)(*(long *)(*(long *)(lVar1 + 0x210) + 0x20) + 9) & 0x80) != 0)) {
    local_78 = QGraphicsWidget::size((QGraphicsWidget *)this);
    local_88.d = (QRegionData *)0x0;
    uStack_80 = 0;
    QRectF::operator&(&local_60,&option->exposedRect);
    local_40 = (QRect)QRectF::toAlignedRect();
    qVar7 = local_40._0_8_;
    if ((local_40.x1.m_i.m_i <= local_40.x2.m_i.m_i) && (local_40.y1.m_i.m_i <= local_40.y2.m_i.m_i)
       ) {
      plVar8 = (long *)QPainter::device();
      iVar5 = (**(code **)(*plVar8 + 0x10))(plVar8);
      if (iVar5 != 1) {
        GVar6 = QGraphicsItem::flags((QGraphicsItem *)(this + 0x10));
        if (((uint)GVar6.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                   super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i & 0x10) != 0) {
          QPainter::setClipRect
                    ((QRect *)painter,(int)*(undefined8 *)(*(long *)(lVar1 + 0x210) + 0x20) + 0x14);
        }
      }
      if ((*(long *)(lVar1 + 0x208) == 0) || (*(int *)(*(long *)(lVar1 + 0x208) + 4) == 0)) {
        this_00 = (QWidget *)0x0;
      }
      else {
        this_00 = *(QWidget **)(lVar1 + 0x210);
      }
      local_60.xp = qVar7;
      QRegion::QRegion(&local_88,&local_40,Rectangle);
      QWidget::render(this_00,painter,(QPoint *)&local_60,&local_88,(RenderFlags)0x3);
      QRegion::~QRegion(&local_88);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsProxyWidget::paint(QPainter *painter, const QStyleOptionGraphicsItem *option, QWidget *widget)
{
    Q_D(QGraphicsProxyWidget);
    Q_UNUSED(widget);
    if (!d->widget || !d->widget->isVisible())
        return;

    // Filter out repaints on the window frame.
    const QRect exposedWidgetRect = (option->exposedRect & rect()).toAlignedRect();
    if (exposedWidgetRect.isEmpty())
        return;

    // When rendering to pdf etc. painting may go outside widget boundaries unless clipped
    if (painter->device()->devType() != QInternal::Widget && (flags() & ItemClipsChildrenToShape))
        painter->setClipRect(d->widget->geometry(), Qt::IntersectClip);

    d->widget->render(painter, exposedWidgetRect.topLeft(), exposedWidgetRect);
}